

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool WindowedKeyTest<Blob<258>,Blob<128>>
               (hashfunc<Blob<128>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  Blob<258> key;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_78;
  int local_58 [6];
  undefined1 uStack_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  
  uVar4 = 1 << (windowbits & 0x1fU);
  local_78.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize(&local_78,(long)(int)uVar4);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x108,
         (ulong)(uint)windowbits,0x108);
  uVar1 = 1;
  if (1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  bVar3 = true;
  uVar4 = 0;
  do {
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    uStack_40 = 0;
    uStack_3f = 0;
    uStack_38 = 0;
    if (windowbits != 0x1f) {
      iVar5 = 0;
      lVar6 = 0;
      do {
        local_58[5] = 0;
        uStack_40 = 0;
        uStack_3f = 0;
        uStack_38 = 0;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_58[0] = iVar5;
        lrot8(local_58,0x21,uVar4);
        (*hash.m_hash)(local_58,0x21,0,
                       (local_78.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                        super__Vector_impl_data._M_start)->bytes + lVar6);
        lVar6 = lVar6 + 0x10;
        iVar5 = iVar5 + 1;
      } while ((ulong)uVar1 * 0x10 != lVar6);
    }
    printf("Window at %3d - ",(ulong)uVar4);
    bVar2 = TestHashList<Blob<128>>
                      (&local_78,drawDiagram,testCollision,testDistribution,false,false);
    bVar3 = (bool)(bVar3 & bVar2);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x109);
  if (local_78.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}